

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.hpp
# Opt level: O0

unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
__thiscall
pstore::broker::
message_queue<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>
::pop(message_queue<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>
      *this)

{
  reference pvVar1;
  anon_class_8_1_8991fb9c in_RSI;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lock;
  message_queue<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>
  *this_local;
  unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
  *res;
  
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_28,&(in_RSI.this)->mut_);
  std::condition_variable::
  wait<pstore::broker::message_queue<std::unique_ptr<pstore::brokerface::message_type,std::default_delete<pstore::brokerface::message_type>>>::pop()::_lambda()_1_>
            (&(in_RSI.this)->cv,(unique_lock<std::mutex> *)local_28,in_RSI);
  pvVar1 = std::
           queue<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>,_std::deque<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>,_std::allocator<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>_>_>
           ::front(&(in_RSI.this)->queue_);
  std::
  unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
  ::unique_ptr((unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
                *)this,pvVar1);
  std::
  queue<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>,_std::deque<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>,_std::allocator<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>_>_>
  ::pop(&(in_RSI.this)->queue_);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return (__uniq_ptr_data<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>,_true,_true>
          )(__uniq_ptr_data<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>,_true,_true>
            )this;
}

Assistant:

T message_queue<T>::pop () {
            std::unique_lock<decltype (mut_)> lock (mut_);
            cv.wait (lock, [this] () { return !queue_.empty (); });
            T res = std::move (queue_.front ());
            queue_.pop ();
            return res;
        }